

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_make_getter_op(sexp ctx,sexp self,sexp_sint_t n,sexp name,sexp type,sexp index)

{
  sexp psVar1;
  
  if ((((ulong)type & 3) == 0) && (type->tag == 1)) {
    type = (sexp)((ulong)(type->value).type.tag * 2 + 1);
  }
  psVar1 = type;
  if (((-1 < (long)type & (byte)type) != 0) &&
     (psVar1 = index, (-1 < (long)index & (byte)index) != 0)) {
    psVar1 = sexp_alloc_tagged_aux(ctx,0x70,0x1b);
    *(undefined4 *)((long)&psVar1->value + 0x58) = 0x13108;
    (psVar1->value).type.id = type;
    (psVar1->value).port.offset = 1;
    (psVar1->value).flonum_bits[0x5c] = '\0';
    (psVar1->value).type.cpl = type;
    (psVar1->value).type.slots = index;
    (psVar1->value).opcode.func = (sexp_proc1)0x0;
    (psVar1->value).type.name = name;
    (psVar1->value).opcode.dl = (sexp)(ctx->value).opcode.func;
    return psVar1;
  }
  psVar1 = sexp_type_exception(ctx,self,2,psVar1);
  return psVar1;
}

Assistant:

sexp sexp_make_getter_op (sexp ctx, sexp self, sexp_sint_t n, sexp name, sexp type, sexp index) {
  if (sexp_typep(type)) type = sexp_make_fixnum(sexp_type_tag(type));
  if ((! sexp_fixnump(type))  || (sexp_unbox_fixnum(type) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, type);
  if ((! sexp_fixnump(index)) || (sexp_unbox_fixnum(index) < 0))
    return sexp_type_exception(ctx, self, SEXP_FIXNUM, index);
  return
    sexp_make_opcode(ctx, self, name, sexp_make_fixnum(SEXP_OPC_GETTER),
                     sexp_make_fixnum(SEXP_OP_SLOT_REF), SEXP_ONE, SEXP_ZERO,
                     type, SEXP_ZERO, SEXP_ZERO, type, index, NULL);
}